

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_split_internal.h
# Opt level: O0

void __thiscall
absl::lts_20250127::strings_internal::
SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByString,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
::SplitIterator(SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByString,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                *this,State state,
               Splitter<absl::lts_20250127::ByString,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
               *splitter)

{
  ByString *pBVar1;
  const_pointer pvVar2;
  size_type sVar3;
  string_view local_60;
  string_view local_50;
  string_view local_40 [2];
  Splitter<absl::lts_20250127::ByString,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *local_20;
  Splitter<absl::lts_20250127::ByString,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *splitter_local;
  SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByString,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *pSStack_10;
  State state_local;
  SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByString,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *this_local;
  
  this->pos_ = 0;
  this->state_ = state;
  local_20 = splitter;
  splitter_local._4_4_ = state;
  pSStack_10 = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&this->curr_);
  this->splitter_ = local_20;
  pBVar1 = Splitter<absl::lts_20250127::ByString,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
           ::delimiter(local_20);
  ByString::ByString(&this->delimiter_,pBVar1);
  Splitter<absl::lts_20250127::ByString,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::predicate(local_20);
  local_40[0] = Splitter<absl::lts_20250127::ByString,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
                ::text(this->splitter_);
  pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::data(local_40);
  if (pvVar2 == (const_pointer)0x0) {
    this->state_ = kEndState;
    local_50 = Splitter<absl::lts_20250127::ByString,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
               ::text(this->splitter_);
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_50);
    this->pos_ = sVar3;
  }
  else if (this->state_ == kEndState) {
    local_60 = Splitter<absl::lts_20250127::ByString,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
               ::text(this->splitter_);
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_60);
    this->pos_ = sVar3;
  }
  else {
    operator++(this);
  }
  return;
}

Assistant:

SplitIterator(State state, const Splitter* splitter)
      : pos_(0),
        state_(state),
        splitter_(splitter),
        delimiter_(splitter->delimiter()),
        predicate_(splitter->predicate()) {
    // Hack to maintain backward compatibility. This one block makes it so an
    // empty absl::string_view whose .data() happens to be nullptr behaves
    // *differently* from an otherwise empty absl::string_view whose .data() is
    // not nullptr. This is an undesirable difference in general, but this
    // behavior is maintained to avoid breaking existing code that happens to
    // depend on this old behavior/bug. Perhaps it will be fixed one day. The
    // difference in behavior is as follows:
    //   Split(absl::string_view(""), '-');  // {""}
    //   Split(absl::string_view(), '-');    // {}
    if (splitter_->text().data() == nullptr) {
      state_ = kEndState;
      pos_ = splitter_->text().size();
      return;
    }

    if (state_ == kEndState) {
      pos_ = splitter_->text().size();
    } else {
      ++(*this);
    }
  }